

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall leveldb::Footer::EncodeTo(Footer *this,string *dst)

{
  long lVar1;
  string *dst_00;
  undefined1 *puVar2;
  BlockHandle *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  size_t original_size;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dst_00 = (string *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     (in_RDI);
  BlockHandle::EncodeTo(in_RSI,dst_00);
  BlockHandle::EncodeTo(in_RSI,dst_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (in_RDI,0x18df5d7);
  PutFixed32(dst_00,(uint32_t)((ulong)in_RDI >> 0x20));
  PutFixed32(dst_00,(uint32_t)((ulong)in_RDI >> 0x20));
  puVar2 = (undefined1 *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     (in_RDI);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &dst_00[1].field_2) {
    __assert_fail("dst->size() == original_size + kEncodedLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/format.cc"
                  ,0x26,"void leveldb::Footer::EncodeTo(std::string *) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Footer::EncodeTo(std::string* dst) const {
  const size_t original_size = dst->size();
  metaindex_handle_.EncodeTo(dst);
  index_handle_.EncodeTo(dst);
  dst->resize(2 * BlockHandle::kMaxEncodedLength);  // Padding
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber & 0xffffffffu));
  PutFixed32(dst, static_cast<uint32_t>(kTableMagicNumber >> 32));
  assert(dst->size() == original_size + kEncodedLength);
  (void)original_size;  // Disable unused variable warning.
}